

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void embree::SceneGraph::resize_randomly
               (RandomSampler *sampler,Ref<embree::SceneGraph::Node> *node,size_t N)

{
  uint uVar1;
  long *plVar2;
  Node *pNVar3;
  reference pvVar4;
  reference __a;
  reference __b;
  reference __a_00;
  reference __b_00;
  size_type sVar5;
  reference __a_01;
  reference __b_01;
  Ref<embree::SceneGraph::Node> *pRVar6;
  Ref<embree::SceneGraph::Node> *in_RDX;
  ulong uVar7;
  RandomSampler *in_RSI;
  uint *in_RDI;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh_4;
  Ref<embree::SceneGraph::PointSetNode> mesh_3;
  size_t j_2;
  size_t i_3;
  Ref<embree::SceneGraph::HairSetNode> mesh_2;
  size_t j_1;
  size_t i_2;
  Ref<embree::SceneGraph::QuadMeshNode> mesh_1;
  size_t j;
  size_t i_1;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  uint n;
  uint m;
  uint n_1;
  uint m_1;
  uint n_2;
  uint m_2;
  value_type *in_stack_fffffffffffff918;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_stack_fffffffffffff920;
  size_type in_stack_fffffffffffff928;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_fffffffffffff930;
  long *local_660;
  long *local_630;
  Ref<embree::SceneGraph::Node> *local_5d8;
  long *local_5a0;
  Ref<embree::SceneGraph::Node> *local_548;
  long *local_510;
  Ref<embree::SceneGraph::Node> *local_4b8;
  long *local_480;
  long *local_428;
  long *local_3e0;
  Ref<embree::SceneGraph::Node> *local_3b0;
  Ref<embree::SceneGraph::Node> *local_398;
  Ref<embree::SceneGraph::Node> *local_380;
  ulong local_360;
  RandomSampler *pRVar8;
  
  pRVar8 = in_RSI;
  if (*(long *)in_RSI == 0) {
    local_3e0 = (long *)0x0;
  }
  else {
    local_3e0 = (long *)__dynamic_cast(*(long *)in_RSI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (local_3e0 != (long *)0x0) {
    (**(code **)(*local_3e0 + 0x10))();
  }
  if (local_3e0 == (long *)0x0) {
    if (*(long *)in_RSI == 0) {
      local_428 = (long *)0x0;
    }
    else {
      local_428 = (long *)__dynamic_cast(*(long *)in_RSI,&Node::typeinfo,&GroupNode::typeinfo,0);
    }
    if (local_428 == (long *)0x0) {
      if (*(long *)in_RSI == 0) {
        local_480 = (long *)0x0;
      }
      else {
        local_480 = (long *)__dynamic_cast(*(long *)in_RSI,&Node::typeinfo,
                                           &TriangleMeshNode::typeinfo,0);
      }
      if (local_480 == (long *)0x0) {
        if (*(long *)in_RSI == 0) {
          local_510 = (long *)0x0;
        }
        else {
          local_510 = (long *)__dynamic_cast(*(long *)in_RSI,&Node::typeinfo,&QuadMeshNode::typeinfo
                                             ,0);
        }
        if (local_510 == (long *)0x0) {
          if (*(long *)in_RSI == 0) {
            local_5a0 = (long *)0x0;
          }
          else {
            local_5a0 = (long *)__dynamic_cast(*(long *)in_RSI,&Node::typeinfo,
                                               &HairSetNode::typeinfo,0);
          }
          if (local_5a0 == (long *)0x0) {
            if (*(long *)in_RSI == 0) {
              local_630 = (long *)0x0;
            }
            else {
              local_630 = (long *)__dynamic_cast(*(long *)in_RSI,&Node::typeinfo,
                                                 &PointSetNode::typeinfo,0);
            }
            if (local_630 == (long *)0x0) {
              if (*(long *)in_RSI == 0) {
                local_660 = (long *)0x0;
              }
              else {
                local_660 = (long *)__dynamic_cast(*(long *)in_RSI,&Node::typeinfo,
                                                   &SubdivMeshNode::typeinfo,0);
              }
              if (local_660 != (long *)0x0) {
                (**(code **)(*local_660 + 0x10))();
                pRVar6 = (Ref<embree::SceneGraph::Node> *)
                         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    (local_660 + 0x22));
                if (in_RDX < pRVar6) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             in_stack_fffffffffffff930,in_stack_fffffffffffff928);
                }
              }
              if (local_660 != (long *)0x0) {
                (**(code **)(*local_660 + 0x18))();
              }
            }
            else {
              (**(code **)(*local_630 + 0x10))();
              pRVar6 = (Ref<embree::SceneGraph::Node> *)
                       std::
                       vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                               *)(local_630 + 0xf));
              if (in_RDX < pRVar6) {
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::resize(in_stack_fffffffffffff930,in_stack_fffffffffffff928);
              }
            }
            if (local_630 != (long *)0x0) {
              (**(code **)(*local_630 + 0x18))();
            }
          }
          else {
            (**(code **)(*local_5a0 + 0x10))();
            sVar5 = std::
                    vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                    ::size((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                            *)(local_5a0 + 0x1b));
            if (sVar5 != 0) {
              for (local_3b0 = (Ref<embree::SceneGraph::Node> *)0x0; local_3b0 < in_RDX;
                  local_3b0 = (Ref<embree::SceneGraph::Node> *)((long)&local_3b0->ptr + 1)) {
                *in_RDI = *in_RDI * 0x19660d + 0x3c6ef35f;
                uVar1 = *in_RDI;
                pRVar6 = (Ref<embree::SceneGraph::Node> *)
                         std::
                         vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                         ::size((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                 *)(local_5a0 + 0x1b));
                local_5d8 = in_RDX;
                if (pRVar6 < in_RDX) {
                  local_5d8 = pRVar6;
                }
                uVar7 = (ulong)(long)(int)(uVar1 >> 1) % (ulong)local_5d8;
                pRVar6 = (Ref<embree::SceneGraph::Node> *)
                         std::
                         vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                         ::size((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                 *)(local_5a0 + 0x1b));
                if (local_3b0 < pRVar6) {
                  __a_01 = std::
                           vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                         *)(local_5a0 + 0x1b),(size_type)local_3b0);
                  __b_01 = std::
                           vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                           ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                         *)(local_5a0 + 0x1b),uVar7);
                  std::swap<embree::SceneGraph::HairSetNode::Hair>(__a_01,__b_01);
                }
                else {
                  std::
                  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                                *)(local_5a0 + 0x1b),uVar7);
                  std::
                  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ::push_back(in_stack_fffffffffffff920,(value_type *)in_stack_fffffffffffff918);
                }
              }
            }
          }
          if (local_5a0 != (long *)0x0) {
            (**(code **)(*local_5a0 + 0x18))();
          }
        }
        else {
          (**(code **)(*local_510 + 0x10))();
          sVar5 = std::
                  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                  ::size((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                          *)(local_510 + 0x17));
          if (sVar5 != 0) {
            for (local_398 = (Ref<embree::SceneGraph::Node> *)0x0; local_398 < in_RDX;
                local_398 = (Ref<embree::SceneGraph::Node> *)((long)&local_398->ptr + 1)) {
              *in_RDI = *in_RDI * 0x19660d + 0x3c6ef35f;
              uVar1 = *in_RDI;
              pRVar6 = (Ref<embree::SceneGraph::Node> *)
                       std::
                       vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                       ::size((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                               *)(local_510 + 0x17));
              local_548 = in_RDX;
              if (pRVar6 < in_RDX) {
                local_548 = pRVar6;
              }
              uVar7 = (ulong)(long)(int)(uVar1 >> 1) % (ulong)local_548;
              pRVar6 = (Ref<embree::SceneGraph::Node> *)
                       std::
                       vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                       ::size((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                               *)(local_510 + 0x17));
              if (local_398 < pRVar6) {
                __a_00 = std::
                         vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                         ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                                       *)(local_510 + 0x17),(size_type)local_398);
                __b_00 = std::
                         vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                         ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                                       *)(local_510 + 0x17),uVar7);
                std::swap<embree::SceneGraph::QuadMeshNode::Quad>(__a_00,__b_00);
              }
              else {
                std::
                vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                              *)(local_510 + 0x17),uVar7);
                std::
                vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                ::push_back((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                             *)in_stack_fffffffffffff920,in_stack_fffffffffffff918);
              }
            }
          }
        }
        if (local_510 != (long *)0x0) {
          (**(code **)(*local_510 + 0x18))();
        }
      }
      else {
        (**(code **)(*local_480 + 0x10))();
        sVar5 = std::
                vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                ::size((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                        *)(local_480 + 0x17));
        if (sVar5 != 0) {
          for (local_380 = (Ref<embree::SceneGraph::Node> *)0x0; local_380 < in_RDX;
              local_380 = (Ref<embree::SceneGraph::Node> *)((long)&local_380->ptr + 1)) {
            *in_RDI = *in_RDI * 0x19660d + 0x3c6ef35f;
            uVar1 = *in_RDI;
            pRVar6 = (Ref<embree::SceneGraph::Node> *)
                     std::
                     vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                     ::size((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                             *)(local_480 + 0x17));
            local_4b8 = in_RDX;
            if (pRVar6 < in_RDX) {
              local_4b8 = pRVar6;
            }
            uVar7 = (ulong)(long)(int)(uVar1 >> 1) % (ulong)local_4b8;
            pRVar6 = (Ref<embree::SceneGraph::Node> *)
                     std::
                     vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                     ::size((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                             *)(local_480 + 0x17));
            if (local_380 < pRVar6) {
              __a = std::
                    vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                    ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                                  *)(local_480 + 0x17),(size_type)local_380);
              __b = std::
                    vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                    ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                                  *)(local_480 + 0x17),uVar7);
              std::swap<embree::SceneGraph::TriangleMeshNode::Triangle>(__a,__b);
            }
            else {
              std::
              vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ::operator[]((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                            *)(local_480 + 0x17),uVar7);
              std::
              vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
              ::push_back((vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                           *)in_stack_fffffffffffff920,(value_type *)in_stack_fffffffffffff918);
            }
          }
        }
      }
      if (local_480 != (long *)0x0) {
        (**(code **)(*local_480 + 0x18))();
      }
    }
    else {
      (**(code **)(*local_428 + 0x10))();
      for (local_360 = 0;
          sVar5 = std::
                  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                          *)(local_428 + 0xd)), local_360 < sVar5; local_360 = local_360 + 1) {
        pvVar4 = std::
                 vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                 ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                               *)(local_428 + 0xd),local_360);
        pNVar3 = pvVar4->ptr;
        if (pNVar3 != (Node *)0x0) {
          (*(pNVar3->super_RefCount)._vptr_RefCount[2])();
        }
        resize_randomly(pRVar8,in_RDX,(size_t)local_3e0);
        if (pNVar3 != (Node *)0x0) {
          (*(pNVar3->super_RefCount)._vptr_RefCount[3])();
        }
      }
    }
    if (local_428 != (long *)0x0) {
      (**(code **)(*local_428 + 0x18))();
    }
  }
  else {
    plVar2 = (long *)local_3e0[0x13];
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x10))();
    }
    resize_randomly(pRVar8,in_RDX,(size_t)local_3e0);
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x18))();
    }
  }
  if (local_3e0 != (long *)0x0) {
    (**(code **)(*local_3e0 + 0x18))();
  }
  return;
}

Assistant:

void SceneGraph::resize_randomly(RandomSampler& sampler, Ref<Node> node, const size_t N)
  {
     if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
       resize_randomly(sampler,xfmNode->child, N);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        resize_randomly(sampler,groupNode->children[i],N);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) 
    {
      if (!mesh->triangles.size()) return;
      for (size_t i=0; i<N; i++) {
        size_t j = RandomSampler_getInt(sampler)%(min(mesh->triangles.size(),N));
        if (i < mesh->triangles.size()) std::swap(mesh->triangles[i],mesh->triangles[j]);
        else                            mesh->triangles.push_back(mesh->triangles[j]);
      }
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      if (!mesh->quads.size()) return;
      for (size_t i=0; i<N; i++) {
        size_t j = RandomSampler_getInt(sampler)%(min(mesh->quads.size(),N));
        if (i < mesh->quads.size()) std::swap(mesh->quads[i],mesh->quads[j]);
        else                        mesh->quads.push_back(mesh->quads[j]);
      }
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      if (!mesh->hairs.size()) return;
      for (size_t i=0; i<N; i++) {
        size_t j = RandomSampler_getInt(sampler)%(min(mesh->hairs.size(),N));
        if (i < mesh->hairs.size()) std::swap(mesh->hairs[i],mesh->hairs[j]);
        else                        mesh->hairs.push_back(mesh->hairs[j]);
      }
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      if (mesh->positions.size() <= N) return;
      mesh->positions.resize(N);
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      if (mesh->verticesPerFace.size() <= N) return;
      mesh->verticesPerFace.resize(N);
    }
  }